

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

Token * __thiscall
wabt::WastLexer::LiteralToken
          (Token *__return_storage_ptr__,WastLexer *this,TokenType token_type,
          LiteralType literal_type)

{
  Location loc;
  Literal local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  GetLocation(this);
  local_60.text = GetText(this,0);
  loc.filename._M_str = (char *)uStack_40;
  loc.filename._M_len = local_48;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_38;
  loc.field_1._8_8_ = uStack_30;
  local_60.type = literal_type;
  Token::Token(__return_storage_ptr__,loc,token_type,&local_60);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::LiteralToken(TokenType token_type, LiteralType literal_type) {
  return Token(GetLocation(), token_type, Literal(literal_type, GetText()));
}